

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Opnd * __thiscall
LowererMD::EnregisterBoolConst(LowererMD *this,Instr *instr,Opnd *opnd,IRType type)

{
  IRType type_00;
  OpndKind OVar1;
  int64 iVar2;
  RegOpnd *pRVar3;
  IntConstOpnd *pIVar4;
  Instr *pIVar5;
  Opnd *pOVar6;
  
  OVar1 = IR::Opnd::GetKind(opnd);
  if (OVar1 != OpndKindIntConst) {
    OVar1 = IR::Opnd::GetKind(opnd);
    if (OVar1 != OpndKindInt64Const) {
      type_00 = opnd->m_type;
      pRVar3 = IR::RegOpnd::New(type_00,this->m_func);
      pIVar4 = IR::IntConstOpnd::New(0,type_00,this->m_func,true);
      pIVar5 = IR::Instr::New(MOV,&pRVar3->super_Opnd,&pIVar4->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar5);
      Legalize<false>(pIVar5,false);
      pOVar6 = IR::Opnd::UseWithNewType(opnd,type_00,this->m_func);
      pIVar5 = IR::Instr::New(SUB,&pRVar3->super_Opnd,&pRVar3->super_Opnd,pOVar6,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar5);
      Legalize<false>(pIVar5,false);
      pIVar4 = IR::IntConstOpnd::New(-1,type_00,this->m_func,true);
      pIVar5 = IR::Instr::New(CMOVS,&pRVar3->super_Opnd,&pRVar3->super_Opnd,&pIVar4->super_Opnd,
                              this->m_func);
      IR::Instr::InsertBefore(instr,pIVar5);
      Legalize<false>(pIVar5,false);
      pOVar6 = IR::Opnd::UseWithNewType(&pRVar3->super_Opnd,type,this->m_func);
      return pOVar6;
    }
  }
  iVar2 = IR::Opnd::GetImmediateValue(opnd,instr->m_func);
  pRVar3 = IR::RegOpnd::New(type,this->m_func);
  pIVar4 = IR::IntConstOpnd::New(-(ulong)(iVar2 != 0),type,this->m_func,true);
  pIVar5 = IR::Instr::New(MOV,&pRVar3->super_Opnd,&pIVar4->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar5);
  return &pRVar3->super_Opnd;
}

Assistant:

IR::Opnd*
LowererMD::EnregisterBoolConst(IR::Instr* instr, IR::Opnd *opnd, IRType type)
{

    if (opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd())
    {
        bool isSet = opnd->GetImmediateValue(instr->m_func) != 0;
        IR::RegOpnd *tempReg = IR::RegOpnd::New(type, m_func);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, tempReg, IR::IntConstOpnd::New(isSet ? -1 : 0, type, m_func, true), m_func));
        return tempReg;
    }

    IRType origType = opnd->GetType();
    IR::RegOpnd *tempReg = IR::RegOpnd::New(origType, m_func);
    IR::Instr* cmovInstr = IR::Instr::New(Js::OpCode::MOV, tempReg, IR::IntConstOpnd::New(0, origType, m_func, true), m_func);
    instr->InsertBefore(cmovInstr);
    Legalize(cmovInstr);
    cmovInstr = IR::Instr::New(Js::OpCode::SUB, tempReg, tempReg, opnd->UseWithNewType(origType, m_func), m_func);
    instr->InsertBefore(cmovInstr);
    Legalize(cmovInstr);
    cmovInstr = IR::Instr::New(Js::OpCode::CMOVS, tempReg, tempReg, IR::IntConstOpnd::New(-1, origType, m_func, true), m_func);
    instr->InsertBefore(cmovInstr);
    Legalize(cmovInstr);
    return tempReg->UseWithNewType(type, m_func);
}